

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::ComputeRequiredData
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZMaterialDataT<double> *data,
          TPZVec<double> *qsi)

{
  int iVar1;
  long lVar2;
  
  TPZInterfaceElement::ComputeRequiredDataT<double>(&this->super_TPZInterfaceElement,data,qsi);
  if ((this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements != 0) {
    lVar2 = (long)(data->super_TPZMaterialData).intLocPtIndex;
    if (lVar2 < 0) {
      iVar1 = -1;
    }
    else {
      iVar1 = (int)(this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore
                   [lVar2];
    }
    (data->super_TPZMaterialData).intGlobPtIndex = iVar1;
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ComputeRequiredData(TPZMaterialDataT<STATE> &data,
                                                         TPZVec<REAL> &qsi){
    TBASE::ComputeRequiredData(data, qsi);
    if(fIntPtIndices.size())
    {
        data.intGlobPtIndex = GetGlobalIntegrationPointIndex(data);
    }
    //material index for the n-th CompEl integration point
}